

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::BDPTIntegrator::Li
          (BDPTIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_5)

{
  uint uVar1;
  Float time;
  float fVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  Array path;
  Array path_00;
  ulong uVar6;
  int t;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [56];
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [56];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  SampledSpectrum SVar19;
  SampledSpectrum v;
  SampledSpectrum SVar20;
  Float misWeight;
  SampledWavelengths *local_f0;
  int local_e8;
  optional<pbrt::Point2<float>_> pFilmNew;
  SampledSpectrum Lpath;
  FilmHandle local_98;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_90;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_88;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uintptr_t local_58;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_50;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_48;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_40;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_38;
  
  path = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)this->maxDepth + 2);
  local_38.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_40.bits =
       (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       .bits;
  iVar4 = GenerateCameraSubpath
                    ((Integrator *)this,ray,lambda,(SamplerHandle *)&local_38,scratchBuffer,
                     this->maxDepth + 2,(CameraHandle *)&local_40,path,this->regularize);
  path_00 = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)this->maxDepth + 1);
  local_48.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_50.bits =
       (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       .bits;
  local_58 = (this->lightSampler).
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits;
  time = (path->field_2).ei.super_Interaction.time;
  auVar9 = ZEXT464((uint)time);
  local_f0 = lambda;
  iVar5 = GenerateLightSubpath
                    ((Integrator *)this,lambda,(SamplerHandle *)&local_48,(CameraHandle *)&local_50,
                     scratchBuffer,this->maxDepth + 1,time,(LightSamplerHandle)&local_58,path_00,
                     this->regularize);
  if (iVar4 < 1) {
    uVar11 = 0;
    uVar14 = 0;
  }
  else {
    auVar16 = ZEXT864(0);
    t = 1;
    local_e8 = iVar4;
    do {
      if (-1 < iVar5) {
        auVar17 = auVar16;
        iVar4 = 0;
        do {
          auVar13 = in_ZMM1._8_56_;
          auVar10 = auVar9._8_56_;
          uVar1 = iVar4 + t;
          auVar16 = auVar17;
          if ((1 < uVar1 && (iVar4 != 1 || t != 1)) && ((int)(uVar1 - 2) <= this->maxDepth)) {
            pFilmNew.set = false;
            misWeight = 0.0;
            local_80.bits =
                 (this->lightSampler).
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 .bits;
            local_88.bits =
                 (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                 super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                 .bits;
            local_90.bits =
                 (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            SVar19 = ConnectBDPT((Integrator *)this,local_f0,path_00,path,iVar4,t,
                                 (LightSamplerHandle *)&local_80,(CameraHandle *)&local_88,
                                 (SamplerHandle *)&local_90,&pFilmNew,&misWeight);
            in_ZMM1._0_8_ = SVar19.values.values._8_8_;
            in_ZMM1._8_56_ = auVar13;
            auVar9._0_8_ = SVar19.values.values._0_8_;
            auVar9._8_56_ = auVar10;
            auVar8 = auVar9._0_16_;
            auVar12 = in_ZMM1._0_16_;
            Lpath.values.values = (array<float,_4>)vunpcklpd_avx(auVar8,auVar12);
            if (pFilmNew.set == true) {
              if (this->visualizeStrategies == false) {
                if (this->visualizeWeights == false) goto LAB_003d6c06;
                auVar15 = SUB6416(ZEXT864(0),0) << 0x40;
                bVar3 = 1;
                auVar18 = ZEXT416(0) << 0x40;
              }
              else {
                auVar18._4_4_ = misWeight;
                auVar18._0_4_ = misWeight;
                auVar18._8_4_ = misWeight;
                auVar18._12_4_ = misWeight;
                auVar18 = vdivps_avx((undefined1  [16])Lpath.values.values,auVar18);
                auVar15 = vshufpd_avx(auVar18,auVar18,1);
                if ((misWeight == 0.0) && (!NAN(misWeight))) {
                  auVar15 = SUB6416(ZEXT864(0),0) << 0x40;
                }
                if ((misWeight == 0.0) && (!NAN(misWeight))) {
                  auVar18 = SUB6416(ZEXT864(0),0) << 0x20;
                }
                bVar3 = this->visualizeWeights;
              }
              if ((bVar3 & 1) == 0) {
                in_ZMM1 = ZEXT1664(auVar15);
                auVar9 = ZEXT1664(auVar18);
              }
              SVar19.values.values._0_8_ = auVar9._0_8_;
              SVar19.values.values._8_8_ = in_ZMM1._0_8_;
              local_78 = auVar12;
              local_68 = auVar8;
              FilmHandle::AddSplat
                        ((this->weightFilms).
                         super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start +
                         ((int)((uVar1 - 2) * (uVar1 + 3)) / 2 + iVar4),(Point2f *)&pFilmNew,SVar19,
                         local_f0);
              auVar9 = ZEXT1664(local_68);
              in_ZMM1 = ZEXT1664(local_78);
            }
LAB_003d6c06:
            auVar16 = ZEXT1664(auVar17._0_16_);
            if (t == 1) {
              if ((auVar9._0_4_ == 0.0) && (!NAN(auVar9._0_4_))) {
                uVar6 = 0xffffffffffffffff;
                do {
                  if (uVar6 == 2) goto LAB_003d6c5a;
                  fVar2 = Lpath.values.values[uVar6 + 2];
                  uVar6 = uVar6 + 1;
                } while ((fVar2 == 0.0) && (!NAN(fVar2)));
                if (2 < uVar6) goto LAB_003d6c5a;
              }
              if (pFilmNew.set == false) {
                LogFatal<char_const(&)[21]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                           ,0x8e6,"Check failed: %s",(char (*) [21])"pFilmNew.has_value()");
              }
              local_98.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
                   *(TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> *)
                    (((this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits & 0xffffffffffff) + 0x340);
              v.values.values._0_8_ = auVar9._0_8_;
              v.values.values._8_8_ = in_ZMM1._0_8_;
              FilmHandle::AddSplat(&local_98,(Point2f *)&pFilmNew,v,local_f0);
              auVar16 = ZEXT1664(auVar17._0_16_);
            }
            else {
              auVar16 = ZEXT1664(CONCAT412(auVar17._12_4_ + Lpath.values.values[3],
                                           CONCAT48(auVar17._8_4_ + Lpath.values.values[2],
                                                    CONCAT44(auVar17._4_4_ + Lpath.values.values[1],
                                                             auVar17._0_4_ + Lpath.values.values[0])
                                                   )));
            }
          }
LAB_003d6c5a:
          bVar7 = iVar4 != iVar5;
          auVar17 = auVar16;
          iVar4 = iVar4 + 1;
        } while (bVar7);
      }
      uVar14 = auVar16._0_8_;
      bVar7 = t != local_e8;
      t = t + 1;
    } while (bVar7);
    auVar8 = vshufpd_avx(auVar16._0_16_,auVar16._0_16_,1);
    uVar11 = auVar8._0_8_;
  }
  SVar20.values.values[2] = (float)(int)uVar11;
  SVar20.values.values[3] = (float)(int)((ulong)uVar11 >> 0x20);
  SVar20.values.values[0] = (float)(int)uVar14;
  SVar20.values.values[1] = (float)(int)((ulong)uVar14 >> 0x20);
  return (SampledSpectrum)SVar20.values.values;
}

Assistant:

SampledSpectrum BDPTIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *) const {
    // Trace the camera and light subpaths
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(maxDepth + 2);
    int nCamera = GenerateCameraSubpath(*this, ray, lambda, sampler, scratchBuffer,
                                        maxDepth + 2, camera, cameraVertices, regularize);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(maxDepth + 1);
    int nLight = GenerateLightSubpath(*this, lambda, sampler, camera, scratchBuffer,
                                      maxDepth + 1, cameraVertices[0].time(),
                                      lightSampler, lightVertices, regularize);

    SampledSpectrum L(0.f);
    // Execute all BDPT connection strategies
    for (int t = 1; t <= nCamera; ++t) {
        for (int s = 0; s <= nLight; ++s) {
            int depth = t + s - 2;
            if ((s == 1 && t == 1) || depth < 0 || depth > maxDepth)
                continue;
            // Execute the $(s, t)$ connection strategy and update _L_
            pstd::optional<Point2f> pFilmNew;
            Float misWeight = 0.f;
            SampledSpectrum Lpath =
                ConnectBDPT(*this, lambda, lightVertices, cameraVertices, s, t,
                            lightSampler, camera, sampler, &pFilmNew, &misWeight);
            PBRT_DBG("%s\n",
                     StringPrintf("Connect bdpt s: %d, t: %d, Lpath: %s, misWeight: %f\n",
                                  s, t, Lpath, misWeight)
                         .c_str());
            if (pFilmNew && (visualizeStrategies || visualizeWeights)) {
                SampledSpectrum value;
                if (visualizeStrategies)
                    value = misWeight == 0 ? SampledSpectrum(0.) : Lpath / misWeight;
                if (visualizeWeights)
                    value = Lpath;
                CHECK(pFilmNew.has_value());
                weightFilms[BufferIndex(s, t)].AddSplat(*pFilmNew, value, lambda);
            }
            if (t != 1)
                L += Lpath;
            else if (Lpath) {
                CHECK(pFilmNew.has_value());
                camera.GetFilm().AddSplat(*pFilmNew, Lpath, lambda);
            }
        }
    }

    return L;
}